

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

double Cudd_ReadCacheUsedSlots(DdManager *dd)

{
  undefined1 auVar1 [16];
  int local_2c;
  int i;
  DdCache *cache;
  long lStack_18;
  int slots;
  unsigned_long used;
  DdManager *dd_local;
  
  lStack_18 = 0;
  for (local_2c = 0; local_2c < (int)dd->cacheSlots; local_2c = local_2c + 1) {
    lStack_18 = (int)(uint)(dd->cache[local_2c].h != 0) + lStack_18;
  }
  auVar1._8_4_ = (int)((ulong)lStack_18 >> 0x20);
  auVar1._0_8_ = lStack_18;
  auVar1._12_4_ = 0x45300000;
  return ((auVar1._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lStack_18) - 4503599627370496.0)) /
         (double)dd->cacheSlots;
}

Assistant:

double
Cudd_ReadCacheUsedSlots(
  DdManager * dd)
{
    unsigned long used = 0;
    int slots = dd->cacheSlots;
    DdCache *cache = dd->cache;
    int i;

    for (i = 0; i < slots; i++) {
        used += cache[i].h != 0;
    }

    return((double)used / (double) dd->cacheSlots);

}